

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                  *this,char *begin,char *end)

{
  type tVar1;
  type it;
  char *in_RDX;
  basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *in_RDI;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  custom_formatter<char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  f;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  basic_format_specs<char> *in_stack_ffffffffffffff68;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffff70;
  format_specs *in_stack_ffffffffffffff80;
  context_type *in_stack_ffffffffffffff88;
  arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffffb0;
  arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffffb8;
  custom_formatter<char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  local_30;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *local_28;
  char *local_20;
  iterator local_18;
  iterator local_8;
  
  local_20 = in_RDX;
  local_28 = internal::
             context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
             ::parse_context((context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                              *)&(in_RDI->
                                 super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                                 ).parse_context_.format_str_.size_);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (in_stack_ffffffffffffff70,(iterator)in_stack_ffffffffffffff68);
  internal::
  custom_formatter<char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  ::custom_formatter(&local_30,
                     (basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                      *)&(in_RDI->
                         super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                         ).parse_context_.format_str_.size_);
  tVar1 = visit_format_arg<fmt::v5::internal::custom_formatter<char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>&,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>
                    ((custom_formatter<char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                      *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (tVar1) {
    local_8 = basic_parse_context<char,_fmt::v5::internal::error_handler>::begin
                        ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)in_RDI);
  }
  else {
    basic_format_specs<char>::basic_format_specs((basic_format_specs<char> *)in_RDI);
    internal::
    specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
    ::specs_handler((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                     *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI);
    basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
    ::type((basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
            *)&in_RDI[1].
               super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
               .parse_context_.format_str_.size_);
    internal::
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_>
    ::specs_checker((specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_>
                     *)in_stack_ffffffffffffff70,
                    (specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                     *)in_stack_ffffffffffffff68,(type)((ulong)in_RDI >> 0x20));
    local_18 = internal::
               parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>>&>
                         (in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                          (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>_>
                           *)in_stack_ffffffffffffff88);
    if ((local_18 == local_20) || (*local_18 != '}')) {
      internal::error_handler::on_error
                ((error_handler *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    }
    basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
              (in_stack_ffffffffffffff70,(iterator)in_stack_ffffffffffffff68);
    arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
    ::arg_formatter(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    it = visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::string>,char>>
                   (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    internal::
    context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
    ::advance_to((context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                  *)&(in_RDI->
                     super_context_base<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char>
                     ).parse_context_.format_str_.size_,(iterator)it.container);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

const Char *on_format_specs(const Char *begin, const Char *end) {
    auto &parse_ctx = context.parse_context();
    parse_ctx.advance_to(begin);
    internal::custom_formatter<Char, Context> f(context);
    if (visit_format_arg(f, arg))
      return parse_ctx.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(begin);
    context.advance_to(visit_format_arg(ArgFormatter(context, &specs), arg));
    return begin;
  }